

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool IsCurrentForFeeEstimation(Chainstate *active_chainstate)

{
  long lVar1;
  seconds t;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  int64_t iVar5;
  duration<long,_std::ratio<3600L,_1L>_> *in_RDI;
  long in_FS_OFFSET;
  ChainstateManager *in_stack_00000070;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  CChain *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
             (AnnotatedMixin<std::recursive_mutex> *)0x7f96e6);
  bVar2 = ChainstateManager::IsInitialBlockDownload(in_stack_00000070);
  if (bVar2) {
    bVar2 = false;
  }
  else {
    CChain::Tip(in_stack_ffffffffffffffd8);
    iVar4 = CBlockIndex::GetBlockTime
                      ((CBlockIndex *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8))
    ;
    GetTime<std::chrono::duration<long,std::ratio<1l,1l>>>();
    std::chrono::operator-
              ((duration<long,_std::ratio<1L,_1L>_> *)
               CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8),in_RDI);
    t.__r._4_4_ = in_stack_ffffffffffffffcc;
    t.__r._0_4_ = in_stack_ffffffffffffffc8;
    iVar5 = count_seconds(t);
    if (iVar4 < iVar5) {
      bVar2 = false;
    }
    else {
      iVar3 = CChain::Height((CChain *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                            );
      if (iVar3 < *(int *)(*(long *)(in_RDI[10].__r + 0xce8) + 0x18) + -1) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(cs_main)
{
    AssertLockHeld(cs_main);
    if (active_chainstate.m_chainman.IsInitialBlockDownload()) {
        return false;
    }
    if (active_chainstate.m_chain.Tip()->GetBlockTime() < count_seconds(GetTime<std::chrono::seconds>() - MAX_FEE_ESTIMATION_TIP_AGE))
        return false;
    if (active_chainstate.m_chain.Height() < active_chainstate.m_chainman.m_best_header->nHeight - 1) {
        return false;
    }
    return true;
}